

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O2

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
::setDepthMask(COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
               *this,bool enable)

{
  if (this->DepthMask != enable) {
    (*GL.DepthMask)(enable);
    this->DepthMask = enable;
  }
  return;
}

Assistant:

void setDepthMask(bool enable)
	{
		if (DepthMask != enable) {
			if (enable)
				GL.DepthMask(GL_TRUE);
			else
				GL.DepthMask(GL_FALSE);

			DepthMask = enable;
		}
	}